

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printChannelList(ChannelList *cl)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  size_t sVar3;
  ostream *this;
  
  p_Var1 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  p_Var2 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
  if (p_Var1 != p_Var2) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n    ",5);
      sVar3 = strlen((char *)(p_Var1 + 1));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)(p_Var1 + 1),sVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      printPixelType(p_Var1[9]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", sampling ",0xb);
      this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var1[9].field_0x4)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(this," ",1);
      std::ostream::operator<<((ostream *)this,*(int *)&p_Var1[9]._M_parent);
      if (*(char *)((long)&p_Var1[9]._M_parent + 4) == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", plinear",9);
      }
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      p_Var2 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    } while (p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void
printChannelList (const ChannelList& cl)
{
    for (ChannelList::ConstIterator i = cl.begin (); i != cl.end (); ++i)
    {
        cout << "\n    " << i.name () << ", ";

        printPixelType (i.channel ().type);

        cout << ", sampling " << i.channel ().xSampling << " "
             << i.channel ().ySampling;

        if (i.channel ().pLinear) cout << ", plinear";
    }
}